

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  impl_type **__lhs;
  basic_resolver_iterator<boost::asio::ip::tcp> *this;
  error_code ec_00;
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  size_t sVar4;
  system_error *this_00;
  type *in_R9;
  int iVar5;
  undefined1 local_6c8 [8];
  query query;
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  socket;
  ostream request_stream;
  undefined1 local_3a8 [8];
  resolver resolver;
  streambuf request;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8 [2];
  basic_resolver_iterator<boost::asio::ip::tcp> local_2e8;
  undefined1 local_2d0 [8];
  streambuf response;
  string path;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248 [2];
  size_type *local_238;
  string status_message;
  string local_208 [8];
  string parameters;
  istream response_stream;
  byte abStack_1c8 [248];
  undefined1 local_d0 [8];
  string server;
  string http_version;
  context context;
  io_service io_service;
  string header;
  undefined1 auStack_40 [4];
  uint status_code;
  error_code ec;
  
  std::__cxx11::string::string
            ((string *)local_d0,"www.instagram.com",
             (allocator *)(query.service_name_.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"/accounts/login/ajax/",
             (allocator *)(query.service_name_.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            (local_208,"username=fewfw&password=fewfw",
             (allocator *)(query.service_name_.field_2._M_local_buf + 8));
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)&resolver.impl_.executor_.prop_fns_,
             0xffffffffffffffff,(allocator<char> *)(query.service_name_.field_2._M_local_buf + 8));
  std::ostream::ostream(&socket.core_.input_.size_,(streambuf *)&resolver.impl_.executor_.prop_fns_)
  ;
  poVar2 = std::operator<<((ostream *)&socket.core_.input_.size_,"POST ");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &response.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar2," HTTP/1.1\r\n");
  poVar2 = std::operator<<((ostream *)&socket.core_.input_.size_,"Host: ");
  poVar2 = std::operator<<(poVar2,(string *)local_d0);
  std::operator<<(poVar2,"\r\n");
  std::operator<<((ostream *)&socket.core_.input_.size_,"Accept: */*\r\n");
  std::operator<<((ostream *)&socket.core_.input_.size_,
                  "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n");
  poVar2 = std::operator<<((ostream *)&socket.core_.input_.size_,"Referer: https://");
  poVar2 = std::operator<<(poVar2,(string *)local_d0);
  std::operator<<(poVar2,"/\r\n");
  poVar2 = std::operator<<((ostream *)&socket.core_.input_.size_,"Content-Length: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\r\n");
  std::operator<<((ostream *)&socket.core_.input_.size_,
                  "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n"
                 );
  std::operator<<((ostream *)&socket.core_.input_.size_,"Connection: close\r\n\r\n");
  std::operator<<((ostream *)&socket.core_.input_.size_,local_208);
  boost::asio::ssl::context::context((context *)((long)&http_version.field_2 + 8),sslv23);
  boost::asio::ssl::context::set_default_verify_paths((context *)((long)&http_version.field_2 + 8));
  boost::asio::io_context::io_context
            ((io_context *)
             &context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  auStack_40 = (undefined1  [4])0x0;
  status_code = status_code & 0xffffff00;
  ec._0_8_ = boost::system::system_category();
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::stream<boost::asio::io_context&>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)(query.service_name_.field_2._M_local_buf + 8),
             (io_context *)
             &context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(context *)((long)&http_version.field_2 + 8));
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_3a8,
             (io_context *)
             &context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(type *)0x0);
  std::__cxx11::string::string
            ((string *)(parameters.field_2._M_local_buf + 8),"https",(allocator *)local_2d0);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_6c8,(string *)local_d0,
             (string *)((long)&parameters.field_2 + 8),address_configured);
  std::__cxx11::string::~string((string *)(parameters.field_2._M_local_buf + 8));
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve((results_type *)((long)&parameters.field_2 + 8),
            (basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)local_3a8,(query *)local_6c8,(error_code *)auStack_40);
  request.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)parameters.field_2._8_8_;
  local_2f8[0]._M_pi = _response_stream;
  parameters.field_2._8_8_ = 0;
  _response_stream = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&response_stream);
  if ((char)status_code == '\x01') {
    (**(code **)(*(long *)ec._0_8_ + 0x20))
              ((undefined1 *)((long)&parameters.field_2 + 8),ec._0_8_,auStack_40);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)(parameters.field_2._M_local_buf + 8));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Resolve OK");
    std::endl<char,std::char_traits<char>>(poVar2);
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::set_verify_mode((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)((long)&query.service_name_.field_2 + 8),1,(error_code *)auStack_40);
    if ((char)status_code == '\x01') {
      (**(code **)(*(long *)ec._0_8_ + 0x20))
                ((undefined1 *)((long)&parameters.field_2 + 8),ec._0_8_,auStack_40);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)(parameters.field_2._M_local_buf + 8)
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      boost::asio::ssl::
      stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
      ::
      set_verify_callback<boost::_bi::bind_t<bool,bool(*)(bool,boost::asio::ssl::verify_context&),boost::_bi::list2<boost::arg<1>,boost::arg<2>>>>
                ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  *)(query.service_name_.field_2._M_local_buf + 8),_local_6c8,
                 (error_code *)verify_certificate);
      if ((char)status_code == '\x01') {
        (**(code **)(*(long *)ec._0_8_ + 0x20))
                  ((undefined1 *)((long)&parameters.field_2 + 8),ec._0_8_,auStack_40);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 (string *)(parameters.field_2._M_local_buf + 8));
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        this = (basic_resolver_iterator<boost::asio::ip::tcp> *)((long)&path.field_2 + 8);
        boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
                  (this,(basic_resolver_iterator<boost::asio::ip::tcp> *)
                        &request.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        boost::asio::
        connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>
                  (&local_2e8,(asio *)(query.service_name_.field_2._M_local_buf + 8),
                   (basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)this,(basic_resolver_iterator<boost::asio::ip::tcp> *)auStack_40,
                   (error_code *)0x0,in_R9);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_2e8.values_.
                    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_248);
        if ((char)status_code == '\x01') {
          (**(code **)(*(long *)ec._0_8_ + 0x20))
                    ((undefined1 *)((long)&parameters.field_2 + 8),ec._0_8_,auStack_40);
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   (string *)(parameters.field_2._M_local_buf + 8));
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Connect OK");
          std::endl<char,std::char_traits<char>>(poVar2);
          boost::asio::ssl::
          stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          ::handshake((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)((long)&query.service_name_.field_2 + 8),client,(error_code *)auStack_40);
          if ((char)status_code == '\x01') {
            (**(code **)(*(long *)ec._0_8_ + 0x20))
                      ((undefined1 *)((long)&parameters.field_2 + 8),ec._0_8_,auStack_40);
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     (string *)(parameters.field_2._M_local_buf + 8));
            std::endl<char,std::char_traits<char>>(poVar2);
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,"Handshake OK");
            std::endl<char,std::char_traits<char>>(poVar2);
            poVar2 = std::operator<<((ostream *)&std::cout,"Print request:");
            poVar2 = std::operator<<(poVar2,"\n****************************************\n");
            poVar2 = std::operator<<(poVar2,(char *)request._8_8_);
            poVar2 = std::operator<<(poVar2,"\n****************************************");
            std::endl<char,std::char_traits<char>>(poVar2);
            boost::asio::
            write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                      ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                        *)((long)&query.service_name_.field_2 + 8),
                       (basic_streambuf<std::allocator<char>_> *)&resolver.impl_.executor_.prop_fns_
                       ,(error_code *)auStack_40);
            if ((char)status_code != '\x01') {
              poVar2 = std::operator<<((ostream *)&std::cout,"Write OK");
              std::endl<char,std::char_traits<char>>(poVar2);
              boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
                        ((basic_streambuf<std::allocator<char>_> *)local_2d0,0xffffffffffffffff,
                         (allocator<char> *)(parameters.field_2._M_local_buf + 8));
              std::__cxx11::string::string
                        ((string *)(parameters.field_2._M_local_buf + 8),"\r\n",
                         (allocator *)(server.field_2._M_local_buf + 8));
              boost::asio::
              read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                        ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                          *)((long)&query.service_name_.field_2 + 8),
                         (basic_streambuf<std::allocator<char>_> *)local_2d0,
                         (string *)((long)&parameters.field_2 + 8));
              std::__cxx11::string::~string((string *)(parameters.field_2._M_local_buf + 8));
              std::istream::istream((void *)((long)&parameters.field_2 + 8),(streambuf *)local_2d0);
              server.field_2._8_8_ = &http_version._M_string_length;
              http_version._M_dataplus._M_p = (pointer)0x0;
              http_version._M_string_length._0_1_ = 0;
              std::operator>>((istream *)(parameters.field_2._M_local_buf + 8),
                              (string *)(server.field_2._M_local_buf + 8));
              std::istream::_M_extract<unsigned_int>((uint *)(parameters.field_2._M_local_buf + 8));
              local_238 = &status_message._M_string_length;
              status_message._M_dataplus._M_p = (pointer)0x0;
              status_message._M_string_length._0_1_ = 0;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)(parameters.field_2._M_local_buf + 8),(string *)&local_238);
              if ((abStack_1c8[*(long *)(parameters.field_2._8_8_ + -0x18)] & 5) == 0) {
                std::__cxx11::string::substr
                          ((ulong)&io_service.impl_,(ulong)((long)&server.field_2 + 8));
                bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&io_service.impl_,"HTTP/");
                std::__cxx11::string::~string((string *)&io_service.impl_);
                if (bVar1) goto LAB_0012c3ab;
                poVar2 = std::operator<<((ostream *)&std::cout,"Response returned with status code "
                                        );
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
                std::endl<char,std::char_traits<char>>(poVar2);
                std::__cxx11::string::string
                          ((string *)&io_service.impl_,"\r\n\r\n",
                           (allocator *)(status_message.field_2._M_local_buf + 8));
                boost::asio::
                read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                          ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                            *)((long)&query.service_name_.field_2 + 8),
                           (basic_streambuf<std::allocator<char>_> *)local_2d0,
                           (string *)&io_service.impl_);
                __lhs = &io_service.impl_;
                std::__cxx11::string::~string((string *)__lhs);
                io_service.impl_ = (impl_type *)&header._M_string_length;
                header._M_dataplus._M_p = (pointer)0x0;
                header._M_string_length._0_1_ = 0;
                while( true ) {
                  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)(parameters.field_2._M_local_buf + 8),
                                      (string *)__lhs);
                  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
                  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"\r");
                  if (!bVar1) break;
                  poVar2 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
                  std::endl<char,std::char_traits<char>>(poVar2);
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                if (response._32_8_ != response._8_8_) {
                  std::ostream::operator<<(&std::cout,(streambuf *)local_2d0);
                }
                while( true ) {
                  sVar4 = boost::asio::
                          read<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>,boost::asio::detail::transfer_at_least_t>
                                    ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                      *)((long)&query.service_name_.field_2 + 8),
                                     (basic_streambuf<std::allocator<char>_> *)local_2d0,
                                     (transfer_at_least_t)0x1,(error_code *)auStack_40);
                  if (sVar4 == 0) break;
                  std::ostream::operator<<(&std::cout,(streambuf *)local_2d0);
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                join_0x00000010_0x00000000_ = boost::asio::error::make_error_code(eof);
                bVar1 = boost::system::operator!=
                                  ((error_code *)auStack_40,
                                   (error_code *)((long)&status_message.field_2 + 8));
                if (bVar1) {
                  this_00 = (system_error *)__cxa_allocate_exception(0x40);
                  ec_00._4_4_ = status_code;
                  ec_00.val_ = (int)auStack_40;
                  ec_00.cat_ = (error_category *)ec._0_8_;
                  boost::system::system_error::system_error(this_00,ec_00);
                  __cxa_throw(this_00,&boost::system::system_error::typeinfo,
                              boost::system::system_error::~system_error);
                }
                std::__cxx11::string::~string((string *)&io_service.impl_);
                iVar5 = 0;
                bVar1 = true;
              }
              else {
LAB_0012c3ab:
                poVar2 = std::operator<<((ostream *)&std::cout,"Invalid response");
                std::endl<char,std::char_traits<char>>(poVar2);
                iVar5 = -1;
                bVar1 = false;
              }
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::string::~string((string *)(server.field_2._M_local_buf + 8));
              std::istream::~istream((void *)((long)&parameters.field_2 + 8));
              boost::asio::basic_streambuf<std::allocator<char>_>::~basic_streambuf
                        ((basic_streambuf<std::allocator<char>_> *)local_2d0);
              goto LAB_0012c1e6;
            }
            (**(code **)(*(long *)ec._0_8_ + 0x20))
                      ((undefined1 *)((long)&parameters.field_2 + 8),ec._0_8_,auStack_40);
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     (string *)(parameters.field_2._M_local_buf + 8));
            std::endl<char,std::char_traits<char>>(poVar2);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)(parameters.field_2._M_local_buf + 8));
  iVar5 = -1;
  bVar1 = false;
LAB_0012c1e6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_2f8);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_6c8);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_3a8);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~stream((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             *)((long)&query.service_name_.field_2 + 8));
  boost::asio::execution_context::~execution_context
            ((execution_context *)
             &context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  boost::asio::ssl::context::~context((context *)((long)&http_version.field_2 + 8));
  std::ios_base::~ios_base((ios_base *)&request_stream);
  boost::asio::basic_streambuf<std::allocator<char>_>::~basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)&resolver.impl_.executor_.prop_fns_);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string
            ((string *)
             &response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_d0);
  if (bVar1) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {

  try {

    // Define server and path
    std::string const server = "www.instagram.com";
    std::string const path = "/accounts/login/ajax/";
    std::string const parameters = "username=fewfw&password=fewfw";

    //while (1) {

      // Define request
      boost::asio::streambuf request;
      std::ostream request_stream(&request);
      request_stream << "POST " << path << " HTTP/1.1\r\n";
      request_stream << "Host: " << server << "\r\n";
      // User-Agent is not mandatory
      request_stream << "Accept: */*\r\n";
      // Accept-Language is not mandatory
      // Accept-Encoding is not mandatory
      request_stream << "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n";
      // Content-Type is not mandatory
      // X-Requested-With is not mandatory
      request_stream << "Referer: https://" << server << "/\r\n";
      request_stream << "Content-Length: " << parameters.size() << "\r\n";
      request_stream
        << "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n";
      request_stream << "Connection: close\r\n\r\n";
      request_stream << parameters;

      // Create ssl context
      boost::asio::ssl::context context(boost::asio::ssl::context::sslv23);
      context.set_default_verify_paths();

      // Create io_service
      boost::asio::io_service io_service;

      // Create the boost system error code
      boost::system::error_code ec;

      // Creatre socket
      boost::asio::ssl::stream<boost::asio::ip::tcp::socket> socket(
          io_service,
          context);

      // Get a list of endpoints corresponding to the server name
      boost::asio::ip::tcp::resolver resolver(io_service);
      boost::asio::ip::tcp::resolver::query query(server, "https");
      boost::asio::ip::tcp::resolver::iterator endpoint_iterator = resolver
          .resolve(query, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Resolve OK" << std::endl;

      // Set the peer verification mode
      socket.set_verify_mode(boost::asio::ssl::verify_peer, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Set the callback used to verify peer certificates
      socket.set_verify_callback(boost::bind(verify_certificate, _1, _2), ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Try each endpoint until we successfully establish a connection
      boost::asio::connect(socket.lowest_layer(), endpoint_iterator, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Connect OK" << std::endl;

      // Perform SSL handshaking
      socket.handshake(boost::asio::ssl::stream_base::client, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Handshake OK" << std::endl;

      // Print the request
      std::cout
        << "Print request:"
        << "\n****************************************\n"
        << boost::asio::buffer_cast<const char*>(request.data())
        << "\n****************************************"
        << std::endl;

      // Send the request
      boost::asio::write(socket, request, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Write OK" << std::endl;

      // Read the response status line. The response streambuf will automatically
      // grow to accommodate the entire line. The growth may be limited by passing
      // a maximum size to the streambuf constructor.
      boost::asio::streambuf response;
      boost::asio::read_until(socket, response, "\r\n");

      // Check that response is OK
      std::istream response_stream(&response);
      std::string http_version;
      response_stream >> http_version;
      unsigned int status_code;
      response_stream >> status_code;
      std::string status_message;
      std::getline(response_stream, status_message);
      if (!response_stream || http_version.substr(0, 5) != "HTTP/") {
        std::cout << "Invalid response" << std::endl;
        return -1;
      }

      // Print the response status code
      std::cout
        << "Response returned with status code "
        << status_code
        << std::endl;

      // Read the response headers, which are terminated by a blank line
      boost::asio::read_until(socket, response, "\r\n\r\n");

      // Process the response headers
      std::string header;
      while (std::getline(response_stream, header) && header != "\r") {
        std::cout << header << std::endl;
      }
      std::cout << std::endl;

      // Write whatever content we already have to output
      if (response.size() > 0) {
        std::cout << &response;
      }

      // Read until EOF, writing data to output as we go
      while (boost::asio::read(
          socket,
          response,
          boost::asio::transfer_at_least(1),
          ec)) {
        std::cout << &response;
      }
      std::cout << std::endl;
      if (ec != boost::asio::error::eof) {
        throw boost::system::system_error(ec);
      }

    //}

  } catch (std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}